

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O2

int UpnpSetMaxSubscriptionTimeOut(UpnpDevice_Handle Hnd,int MaxSubscriptionTimeOut)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  int line;
  char *file;
  Handle_Info *SInfo;
  
  iVar2 = (int)&SInfo;
  SInfo = (Handle_Info *)0x0;
  if (UpnpSdkInit == 1) {
    line = 6;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x86e,"Inside UpnpSetMaxSubscriptionTimeOut\n"
              );
    HandleLock((char *)0x871,line);
    UVar1 = GetHandleInfo(Hnd,&SInfo);
    if (UVar1 == HND_DEVICE) {
      if (-2 < MaxSubscriptionTimeOut) {
        SInfo->MaxSubscriptionTimeOut = MaxSubscriptionTimeOut;
        HandleUnlock((char *)0x881,iVar2);
        UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x886,
                   "Exiting UpnpSetMaxSubscriptionTimeOut\n");
        return 0;
      }
      file = (char *)0x87c;
    }
    else {
      file = (char *)0x877;
    }
    HandleUnlock(file,iVar2);
    iVar2 = -100;
  }
  else {
    iVar2 = -0x74;
  }
  return iVar2;
}

Assistant:

int UpnpSetMaxSubscriptionTimeOut(
	UpnpDevice_Handle Hnd, int MaxSubscriptionTimeOut)
{
	struct Handle_Info *SInfo = NULL;

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpSetMaxSubscriptionTimeOut\n");

	HandleLock(__FILE__, __LINE__);

	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if ((MaxSubscriptionTimeOut != UPNP_INFINITE) &&
		(MaxSubscriptionTimeOut < 0)) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}

	SInfo->MaxSubscriptionTimeOut = MaxSubscriptionTimeOut;
	HandleUnlock(__FILE__, __LINE__);

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSetMaxSubscriptionTimeOut\n");

	return UPNP_E_SUCCESS;
}